

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O2

int Cbs2_ManDecideHighest(Cbs2_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  
  iVar3 = 0;
  for (lVar4 = (long)(p->pJust).iHead;
      (lVar4 < (p->pJust).iTail && (iVar1 = (p->pJust).pData[lVar4], iVar1 != 0)); lVar4 = lVar4 + 1
      ) {
    iVar2 = iVar1;
    if (iVar1 < iVar3) {
      iVar2 = iVar3;
    }
    bVar5 = iVar3 == 0;
    iVar3 = iVar2;
    if (bVar5) {
      iVar3 = iVar1;
    }
  }
  return iVar3;
}

Assistant:

static inline int Cbs2_ManDecideHighest( Cbs2_Man_t * p )
{
    int i, iObj, iObjMax = 0;
    Cbs2_QueForEachEntry( p->pJust, iObj, i )
        if ( iObjMax == 0 || iObjMax < iObj )
            iObjMax = iObj;
    return iObjMax;
}